

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_rand.c
# Opt level: O0

int BN_rand_range(BIGNUM *rnd,BIGNUM *range)

{
  int iVar1;
  int iVar2;
  int in_ECX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  int count;
  int n;
  int local_20;
  int local_4;
  
  local_20 = 100;
  if ((range->neg == 0) && (iVar1 = BN_is_zero((BIGNUM *)range), iVar1 == 0)) {
    iVar1 = BN_num_bits(range);
    if (iVar1 == 1) {
      BN_zero_ex((BIGNUM *)rnd);
    }
    else {
      iVar2 = BN_is_bit_set(range,iVar1 + -2);
      uVar3 = extraout_RDX;
      if ((iVar2 == 0) &&
         (iVar2 = BN_is_bit_set(range,iVar1 + -3), uVar3 = extraout_RDX_00, iVar2 == 0)) {
        do {
          iVar2 = BN_rand(rnd,iVar1 + 1,(int)uVar3,in_ECX);
          if (iVar2 == 0) {
            return 0;
          }
          iVar2 = BN_cmp(rnd,range);
          if (-1 < iVar2) {
            iVar2 = BN_sub(rnd,rnd,range);
            if (iVar2 == 0) {
              return 0;
            }
            iVar2 = BN_cmp(rnd,range);
            if ((-1 < iVar2) && (iVar2 = BN_sub(rnd,rnd,range), iVar2 == 0)) {
              return 0;
            }
          }
          local_20 = local_20 + -1;
          if (local_20 == 0) {
            return 0;
          }
          iVar2 = BN_cmp(rnd,range);
          uVar3 = extraout_RDX_01;
        } while (-1 < iVar2);
      }
      else {
        do {
          iVar2 = BN_rand(rnd,iVar1,(int)uVar3,in_ECX);
          if (iVar2 == 0) {
            return 0;
          }
          local_20 = local_20 + -1;
          if (local_20 == 0) {
            return 0;
          }
          iVar2 = BN_cmp(rnd,range);
          uVar3 = extraout_RDX_02;
        } while (-1 < iVar2);
      }
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int BN_rand_range(BIGNUM *r, const BIGNUM *range)
{
    int n;
    int count = 100;

    if (range->neg || BN_is_zero(range)) {
        //BNerr(BN_F_BN_RAND_RANGE, BN_R_INVALID_RANGE);
        return 0;
    }

    n = BN_num_bits(range);     /* n > 0 */

    /* BN_is_bit_set(range, n - 1) always holds */

    if (n == 1)
        BN_zero(r);
    else if (!BN_is_bit_set(range, n - 2) && !BN_is_bit_set(range, n - 3)) {
        /*
         * range = 100..._2, so 3*range (= 11..._2) is exactly one bit longer
         * than range
         */
        do {
            if (!BN_rand(r, n + 1))
                return 0;
            /*
             * If r < 3*range, use r := r MOD range (which is either r, r -
             * range, or r - 2*range). Otherwise, iterate once more. Since
             * 3*range = 11..._2, each iteration succeeds with probability >=
             * .75.
             */
            if (BN_cmp(r, range) >= 0) {
                if (!BN_sub(r, r, range))
                    return 0;
                if (BN_cmp(r, range) >= 0)
                    if (!BN_sub(r, r, range))
                        return 0;
            }

            if (!--count) {
                //BNerr(BN_F_BN_RAND_RANGE, BN_R_TOO_MANY_ITERATIONS);
                return 0;
            }

        }
        while (BN_cmp(r, range) >= 0);
    } else {
        do {
            /* range = 11..._2  or  range = 101..._2 */
            if (!BN_rand(r, n))
                return 0;

            if (!--count) {
                //BNerr(BN_F_BN_RAND_RANGE, BN_R_TOO_MANY_ITERATIONS);
                return 0;
            }
        }
        while (BN_cmp(r, range) >= 0);
    }

    bn_check_top(r);
    return 1;
}